

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O3

int lws_tls_alloc_pem_to_der_file
              (lws_context *context,char *filename,char *inbuf,lws_filepos_t inlen,uint8_t **buf,
              lws_filepos_t *amount)

{
  lws_filepos_t lVar1;
  uint8_t uVar2;
  int iVar3;
  uint8_t *puVar4;
  char *format;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  lws_filepos_t len;
  uint8_t *local_40;
  lws_filepos_t local_38;
  
  local_40 = (uint8_t *)0x0;
  if (filename == (char *)0x0) {
    local_38 = inlen;
    iVar3 = strncmp(inbuf,"-----",5);
    if (iVar3 != 0) goto LAB_0012734b;
    puVar4 = (uint8_t *)lws_realloc((void *)0x0,inlen * 3 >> 2,"alloc_der");
    local_40 = puVar4;
    if (puVar4 == (uint8_t *)0x0) {
      _lws_log(1,"a\n");
      return 1;
    }
    puVar5 = (uint8_t *)(inbuf + inlen);
  }
  else {
    iVar3 = alloc_file(context,filename,&local_40,&local_38);
    lVar1 = local_38;
    puVar4 = local_40;
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = strncmp((char *)local_40,"-----",5);
    if (iVar3 != 0) {
LAB_0012734b:
      puVar4 = (uint8_t *)lws_realloc((void *)0x0,inlen,"alloc_der");
      if (puVar4 == (uint8_t *)0x0) {
        return 1;
      }
      memcpy(puVar4,inbuf,inlen);
      *buf = puVar4;
      *amount = inlen;
      return 0;
    }
    puVar5 = puVar4 + lVar1;
    inlen = lVar1;
    inbuf = (char *)puVar4;
  }
  puVar7 = (uint8_t *)inbuf + 5;
  if (5 < (long)inlen) {
    do {
      uVar2 = *puVar7;
      if ((uVar2 == '\n') || (uVar2 == '-')) goto LAB_001273f8;
      puVar7 = puVar7 + 1;
    } while (puVar7 < puVar5);
  }
  uVar2 = *puVar7;
LAB_001273f8:
  if (uVar2 == '-') {
    format = "c\n";
    if (puVar7 < puVar5) {
      iVar3 = (int)puVar7;
      do {
        iVar3 = iVar3 + 1;
        if (*puVar7 == '\n') {
          puVar5 = puVar5 + -2;
          puVar6 = puVar5;
          goto joined_r0x0012746d;
        }
        puVar7 = puVar7 + 1;
      } while (puVar7 < puVar5);
    }
  }
  else {
    format = "b\n";
  }
  goto LAB_00127423;
joined_r0x0012746d:
  if (puVar5 <= inbuf) goto LAB_0012747f;
  puVar6 = puVar5;
  if (*puVar5 == '\n') goto LAB_00127484;
  puVar5 = puVar5 + -1;
  puVar6 = (uint8_t *)inbuf;
  goto joined_r0x0012746d;
LAB_0012747f:
  if (*puVar6 == '\n') {
LAB_00127484:
    if (filename != (char *)0x0) {
      *puVar6 = '\0';
      puVar4 = local_40;
    }
    iVar3 = lws_b64_decode_string_len
                      ((char *)(puVar7 + 1),(int)puVar6 - iVar3,(char *)puVar4,(int)inlen);
    *amount = (long)iVar3;
    *buf = puVar4;
    return 0;
  }
  format = "d\n";
LAB_00127423:
  _lws_log(1,format);
  lws_realloc(puVar4,0,"lws_free");
  return 4;
}

Assistant:

int
lws_tls_alloc_pem_to_der_file(struct lws_context *context, const char *filename,
			      const char *inbuf, lws_filepos_t inlen,
			      uint8_t **buf, lws_filepos_t *amount)
{
	uint8_t *pem = NULL, *p, *end, *opem;
	lws_filepos_t len;
	uint8_t *q;
	int n;

	if (filename) {
		n = alloc_file(context, filename, (uint8_t **)&pem, &len);
		if (n)
			return n;
	} else {
		pem = (uint8_t *)inbuf;
		len = inlen;
	}

	opem = p = pem;
	end = p + len;

	if (strncmp((char *)p, "-----", 5)) {

		/* take it as being already DER */

		pem = lws_malloc((size_t)inlen, "alloc_der");
		if (!pem)
			return 1;

		memcpy(pem, inbuf, (size_t)inlen);

		*buf = pem;
		*amount = inlen;

		return 0;
	}

	/* PEM -> DER */

	if (!filename) {
		/* we don't know if it's in const memory... alloc the output */
		pem = lws_malloc(((size_t)inlen * 3) / 4, "alloc_der");
		if (!pem) {
			lwsl_err("a\n");
			return 1;
		}


	} /* else overwrite the allocated, b64 input with decoded DER */

	/* trim the first line */

	p += 5;
	while (p < end && *p != '\n' && *p != '-')
		p++;

	if (*p != '-') {
		lwsl_err("b\n");
		goto bail;
	}

	while (p < end && *p != '\n')
		p++;

	if (p >= end) {
		lwsl_err("c\n");
		goto bail;
	}

	p++;

	/* trim the last line */

	q = (uint8_t *)end - 2;

	while (q > opem && *q != '\n')
		q--;

	if (*q != '\n') {
		lwsl_err("d\n");
		goto bail;
	}

	/* we can't write into the input buffer for mem, since it may be in RO
	 * const segment
	 */
	if (filename)
		*q = '\0';

	*amount = lws_b64_decode_string_len((char *)p, lws_ptr_diff(q, p),
					    (char *)pem, (int)(long long)len);
	*buf = (uint8_t *)pem;

	return 0;

bail:
	lws_free((uint8_t *)pem);

	return 4;
}